

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O3

void __thiscall
Assimp::LWOImporter::FindVCChannels
          (LWOImporter *this,Surface *surf,SortedRep *sorted,Layer *layer,uint *out)

{
  long lVar1;
  uint uVar2;
  size_t __n;
  pointer pFVar3;
  pointer pfVar4;
  int iVar5;
  Logger *this_00;
  long *plVar6;
  uint *puVar7;
  ulong uVar8;
  string *__rhs;
  long *plVar9;
  uint *puVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  pointer pVVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int iVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  long *local_70;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pVVar15 = (layer->mVColorChannels).
            super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((layer->mVColorChannels).
      super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
      _M_impl.super__Vector_impl_data._M_finish == pVVar15) {
    uVar16 = 0;
  }
  else {
    uVar11 = 0;
    uVar16 = 0;
    auVar21 = _DAT_006a4680;
    do {
      __rhs = &pVVar15[uVar11].super_VMapEntry.name;
      __n = (surf->mVCMap)._M_string_length;
      uVar12 = (uint)uVar11;
      if ((__n == pVVar15[uVar11].super_VMapEntry.name._M_string_length) &&
         ((__n == 0 ||
          (iVar5 = bcmp((surf->mVCMap)._M_dataplus._M_p,(__rhs->_M_dataplus)._M_p,__n),
          auVar21 = _DAT_006a4680, iVar5 == 0)))) {
        if (uVar16 != 0) {
          uVar2 = *out;
          uVar11 = 7;
          if (uVar16 < 7) {
            uVar11 = (ulong)uVar16;
          }
          lVar1 = uVar11 - 1;
          auVar17._8_4_ = (int)lVar1;
          auVar17._0_8_ = lVar1;
          auVar17._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar17 = auVar17 ^ auVar21;
          uVar8 = 0;
          do {
            auVar18._8_4_ = (int)uVar8;
            auVar18._0_8_ = uVar8;
            auVar18._12_4_ = (int)(uVar8 >> 0x20);
            auVar19 = (auVar18 | _DAT_006a61f0) ^ auVar21;
            iVar5 = auVar17._4_4_;
            if ((bool)(~(iVar5 < auVar19._4_4_ ||
                        auVar17._0_4_ < auVar19._0_4_ && auVar19._4_4_ == iVar5) & 1)) {
              out[uVar8 + 1] = uVar2;
            }
            if (auVar19._12_4_ <= auVar17._12_4_ &&
                (auVar19._8_4_ <= auVar17._8_4_ || auVar19._12_4_ != auVar17._12_4_)) {
              out[uVar8 + 2] = uVar2;
            }
            auVar18 = (auVar18 | _DAT_006a61e0) ^ auVar21;
            iVar20 = auVar18._4_4_;
            if (iVar20 <= iVar5 && (iVar20 != iVar5 || auVar18._0_4_ <= auVar17._0_4_)) {
              out[uVar8 + 3] = uVar2;
              out[uVar8 + 4] = uVar2;
            }
            uVar8 = uVar8 + 4;
          } while (((int)uVar11 + 3U & 0xc) != uVar8);
        }
        *out = uVar12;
        uVar16 = uVar16 + 1;
      }
      else {
        puVar10 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        puVar7 = (sorted->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        if (puVar10 != puVar7) {
          do {
            pFVar3 = (layer->mFaces).
                     super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar8 = (ulong)pFVar3[*puVar10].super_aiFace.mNumIndices;
            if (uVar8 != 0) {
              uVar13 = 0;
              do {
                uVar2 = pFVar3[*puVar10].super_aiFace.mIndices[uVar13];
                uVar14 = (ulong)uVar2;
                if ((pVVar15[uVar11].super_VMapEntry.abAssigned.
                     super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                     _M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] >> (uVar14 & 0x3f) & 1) != 0
                   ) {
                  pfVar4 = pVVar15[uVar11].super_VMapEntry.rawData.
                           super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  if (((((pfVar4[uVar14 * 4] != 0.0) || (NAN(pfVar4[uVar14 * 4]))) ||
                       (pfVar4[uVar14 * 4 + 1] != 0.0)) ||
                      ((NAN(pfVar4[uVar14 * 4 + 1]) || (pfVar4[uVar14 * 4 + 2] != 0.0)))) ||
                     ((NAN(pfVar4[uVar14 * 4 + 2]) ||
                      ((pfVar4[uVar14 * 4 + 3] != 1.0 || (NAN(pfVar4[uVar14 * 4 + 3]))))))) {
                    if (uVar16 < 8) {
                      uVar8 = (ulong)uVar16;
                      uVar16 = uVar16 + 1;
                      out[uVar8] = uVar12;
                    }
                    else {
                      this_00 = DefaultLogger::get();
                      std::operator+(&local_50,
                                     "LWO: Maximum number of vertex color channels for this mesh reached. Skipping channel \'"
                                     ,__rhs);
                      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
                      local_70 = &local_60;
                      plVar9 = plVar6 + 2;
                      if ((long *)*plVar6 == plVar9) {
                        local_60 = *plVar9;
                        lStack_58 = plVar6[3];
                      }
                      else {
                        local_60 = *plVar9;
                        local_70 = (long *)*plVar6;
                      }
                      *plVar6 = (long)plVar9;
                      plVar6[1] = 0;
                      *(undefined1 *)(plVar6 + 2) = 0;
                      Logger::error(this_00,(char *)local_70);
                      if (local_70 != &local_60) {
                        operator_delete(local_70,local_60 + 1);
                      }
                      auVar21 = _DAT_006a4680;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_50._M_dataplus._M_p != &local_50.field_2) {
                        operator_delete(local_50._M_dataplus._M_p,
                                        local_50.field_2._M_allocated_capacity + 1);
                        auVar21 = _DAT_006a4680;
                      }
                    }
                    puVar7 = (sorted->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish;
                    puVar10 = puVar7 + -1;
                    break;
                  }
                }
                uVar13 = uVar13 + 1;
              } while (uVar8 != uVar13);
            }
            puVar10 = puVar10 + 1;
          } while (puVar10 != puVar7);
        }
      }
      uVar11 = (ulong)(uVar12 + 1);
      pVVar15 = (layer->mVColorChannels).
                super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(layer->mVColorChannels).
                     super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar15 >> 4) *
              0x6db6db6db6db6db7;
    } while (uVar11 <= uVar8 && uVar8 - uVar11 != 0);
    if (uVar16 == 8) {
      return;
    }
  }
  out[uVar16] = 0xffffffff;
  return;
}

Assistant:

void LWOImporter::FindVCChannels(const LWO::Surface& surf, LWO::SortedRep& sorted, const LWO::Layer& layer,
    unsigned int out[AI_MAX_NUMBER_OF_COLOR_SETS])
{
    unsigned int next = 0;

    // Check whether we have an vc entry != 0 for one of the faces in 'sorted'
    for (unsigned int i = 0; i < layer.mVColorChannels.size();++i)  {
        const LWO::VColorChannel& vc = layer.mVColorChannels[i];

        if (surf.mVCMap == vc.name) {
            // The vertex color map is explicitly requested by the surface so we need to take special care of it
            for (unsigned int a = 0; a < std::min(next,AI_MAX_NUMBER_OF_COLOR_SETS-1u); ++a) {
                out[a+1] = out[a];
            }
            out[0] = i;
            ++next;
        }
        else {

            for (LWO::SortedRep::iterator it = sorted.begin(); it != sorted.end(); ++it)    {
                const LWO::Face& face = layer.mFaces[*it];

                for (unsigned int n = 0; n < face.mNumIndices; ++n) {
                    unsigned int idx = face.mIndices[n];

                    if (vc.abAssigned[idx] && ((aiColor4D*)&vc.rawData[0])[idx] != aiColor4D(0.0,0.0,0.0,1.0)) {
                        if (next >= AI_MAX_NUMBER_OF_COLOR_SETS) {

                            ASSIMP_LOG_ERROR("LWO: Maximum number of vertex color channels for "
                                "this mesh reached. Skipping channel \'" + vc.name + "\'");

                        }
                        else {
                            out[next++] = i;
                        }
                        it = sorted.end()-1;
                        break;
                    }
                }
            }
        }
    }
    if (next != AI_MAX_NUMBER_OF_COLOR_SETS) {
        out[next] = UINT_MAX;
    }
}